

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenNativeTablePack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  FieldDef *pFVar1;
  bool bVar2;
  reference ppFVar3;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f70;
  string local_f50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  undefined1 local_c70 [8];
  string prefix;
  undefined1 local_c30 [8];
  string offset_1;
  string field_fn;
  string field_field_1;
  FieldDef *field_1;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_bc0;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  undefined4 local_a74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  Type local_930;
  string local_910;
  Type local_8f0;
  string local_8d0;
  string local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  string local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined1 local_3f0 [8];
  string offsets;
  string length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string offset;
  string field_var;
  string field_field;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_c0;
  const_iterator it;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string struct_type;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  struct_type.field_2._8_8_ = code_ptr;
  IdlNamer::Type_abi_cxx11_((string *)local_48,&this->namer_,struct_def);
  NativeName_abi_cxx11_(&local_a8,this,struct_def);
  std::operator+(&local_88,"func (t *",&local_a8);
  std::operator+(&local_68,&local_88,") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n"
                );
  std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::operator+=
            ((string *)struct_type.field_2._8_8_,"\tif t == nil {\n\t\treturn 0\n\t}\n");
  local_c0._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  do {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar2 = __gnu_cxx::operator!=
                      (&local_c0,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,"\t"
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)
      ;
      std::operator+(&local_b98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                     "Start(builder)\n");
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_b98);
      std::__cxx11::string::~string((string *)&local_b98);
      std::__cxx11::string::~string((string *)&it_1);
      local_bc0._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (&(struct_def->fields).vec);
      while( true ) {
        field_1 = (FieldDef *)
                  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                  end(&(struct_def->fields).vec);
        bVar2 = __gnu_cxx::operator!=
                          (&local_bc0,
                           (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            *)&field_1);
        if (!bVar2) break;
        ppFVar3 = __gnu_cxx::
                  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                  ::operator*(&local_bc0);
        pFVar1 = *ppFVar3;
        if ((pFVar1->deprecated & 1U) == 0) {
          IdlNamer::Field_abi_cxx11_((string *)((long)&field_fn.field_2 + 8),&this->namer_,pFVar1);
          IdlNamer::Function_abi_cxx11_
                    ((string *)((long)&offset_1.field_2 + 8),&this->namer_,&pFVar1->super_Definition
                    );
          IdlNamer::Variable_abi_cxx11_((string *)((long)&prefix.field_2 + 8),&this->namer_,pFVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c30,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&prefix.field_2 + 8),"Offset");
          std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
          bVar2 = IsScalar((pFVar1->value).type.base_type);
          if (bVar2) {
            std::__cxx11::string::string((string *)local_c70);
            bVar2 = FieldDef::IsScalarOptional(pFVar1);
            if (bVar2) {
              std::operator+(&local_cb0,"\tif t.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_fn.field_2 + 8));
              std::operator+(&local_c90,&local_cb0," != nil {\n\t");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_c90);
              std::__cxx11::string::~string((string *)&local_c90);
              std::__cxx11::string::~string((string *)&local_cb0);
              std::__cxx11::string::operator=((string *)local_c70,"*");
            }
            if (((pFVar1->value).type.enum_def == (EnumDef *)0x0) ||
               ((((pFVar1->value).type.enum_def)->is_union & 1U) == 0)) {
              std::operator+(&local_db0,"\t",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_48);
              std::operator+(&local_d90,&local_db0,"Add");
              std::operator+(&local_d70,&local_d90,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&offset_1.field_2 + 8));
              std::operator+(&local_d50,&local_d70,"(builder, ");
              std::operator+(&local_d30,&local_d50,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c70);
              std::operator+(&local_d10,&local_d30,"t.");
              std::operator+(&local_cf0,&local_d10,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_fn.field_2 + 8));
              std::operator+(&local_cd0,&local_cf0,")\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_cd0);
              std::__cxx11::string::~string((string *)&local_cd0);
              std::__cxx11::string::~string((string *)&local_cf0);
              std::__cxx11::string::~string((string *)&local_d10);
              std::__cxx11::string::~string((string *)&local_d30);
              std::__cxx11::string::~string((string *)&local_d50);
              std::__cxx11::string::~string((string *)&local_d70);
              std::__cxx11::string::~string((string *)&local_d90);
              std::__cxx11::string::~string((string *)&local_db0);
            }
            bVar2 = FieldDef::IsScalarOptional(pFVar1);
            if (bVar2) {
              std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t}\n");
            }
            std::__cxx11::string::~string((string *)local_c70);
          }
          else {
            if (((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) &&
               ((((pFVar1->value).type.struct_def)->fixed & 1U) != 0)) {
              std::operator+(&local_e30,"\t",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c30);
              std::operator+(&local_e10,&local_e30," := t.");
              std::operator+(&local_df0,&local_e10,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_fn.field_2 + 8));
              std::operator+(&local_dd0,&local_df0,".Pack(builder)\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_dd0);
              std::__cxx11::string::~string((string *)&local_dd0);
              std::__cxx11::string::~string((string *)&local_df0);
              std::__cxx11::string::~string((string *)&local_e10);
              std::__cxx11::string::~string((string *)&local_e30);
            }
            else if (((pFVar1->value).type.enum_def != (EnumDef *)0x0) &&
                    ((((pFVar1->value).type.enum_def)->is_union & 1U) != 0)) {
              std::operator+(&local_e70,"\tif t.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_fn.field_2 + 8));
              std::operator+(&local_e50,&local_e70," != nil {\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_e50);
              std::__cxx11::string::~string((string *)&local_e50);
              std::__cxx11::string::~string((string *)&local_e70);
              std::operator+(&local_f30,"\t\t",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_48);
              std::operator+(&local_f10,&local_f30,"Add");
              __rhs = UnionTypeFieldSuffix();
              std::operator+(&local_f70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar1,__rhs);
              Namer::Method(&local_f50,&(this->namer_).super_Namer,&local_f70);
              std::operator+(&local_ef0,&local_f10,&local_f50);
              std::operator+(&local_ed0,&local_ef0,"(builder, t.");
              std::operator+(&local_eb0,&local_ed0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_fn.field_2 + 8));
              std::operator+(&local_e90,&local_eb0,".Type)\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_e90);
              std::__cxx11::string::~string((string *)&local_e90);
              std::__cxx11::string::~string((string *)&local_eb0);
              std::__cxx11::string::~string((string *)&local_ed0);
              std::__cxx11::string::~string((string *)&local_ef0);
              std::__cxx11::string::~string((string *)&local_f50);
              std::__cxx11::string::~string((string *)&local_f70);
              std::__cxx11::string::~string((string *)&local_f10);
              std::__cxx11::string::~string((string *)&local_f30);
              std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t}\n");
            }
            std::operator+(&local_1030,"\t",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
            std::operator+(&local_1010,&local_1030,"Add");
            std::operator+(&local_ff0,&local_1010,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&offset_1.field_2 + 8));
            std::operator+(&local_fd0,&local_ff0,"(builder, ");
            std::operator+(&local_fb0,&local_fd0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c30);
            std::operator+(&local_f90,&local_fb0,")\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_f90);
            std::__cxx11::string::~string((string *)&local_f90);
            std::__cxx11::string::~string((string *)&local_fb0);
            std::__cxx11::string::~string((string *)&local_fd0);
            std::__cxx11::string::~string((string *)&local_ff0);
            std::__cxx11::string::~string((string *)&local_1010);
            std::__cxx11::string::~string((string *)&local_1030);
          }
          std::__cxx11::string::~string((string *)local_c30);
          std::__cxx11::string::~string((string *)(offset_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(field_fn.field_2._M_local_buf + 8));
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&local_bc0);
      }
      std::operator+(&local_1070,"\treturn ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_1050,&local_1070,"End(builder)\n");
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_1050);
      std::__cxx11::string::~string((string *)&local_1050);
      std::__cxx11::string::~string((string *)&local_1070);
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"}\n\n");
      std::__cxx11::string::~string((string *)local_48);
      return;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_c0);
    pFVar1 = *ppFVar3;
    if (((pFVar1->deprecated & 1U) == 0) &&
       (bVar2 = IsScalar((pFVar1->value).type.base_type), !bVar2)) {
      IdlNamer::Field_abi_cxx11_((string *)((long)&field_var.field_2 + 8),&this->namer_,pFVar1);
      IdlNamer::Variable_abi_cxx11_((string *)((long)&offset.field_2 + 8),&this->namer_,pFVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&offset.field_2 + 8),"Offset");
      bVar2 = IsString(&(pFVar1->value).type);
      if (bVar2) {
        std::operator+(&local_170,"\t",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130);
        std::operator+(&local_150,&local_170," := flatbuffers.UOffsetT(0)\n");
        std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::operator+(&local_1b0,"\tif t.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_var.field_2 + 8));
        std::operator+(&local_190,&local_1b0," != \"\" {\n");
        std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::operator+(&local_230,"\t\t",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130);
        std::operator+(&local_210,&local_230," = builder.CreateString(t.");
        std::operator+(&local_1f0,&local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_var.field_2 + 8));
        std::operator+(&local_1d0,&local_1f0,")\n");
        std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t}\n");
LAB_00290fd3:
        local_a74 = 0;
      }
      else {
        bVar2 = IsVector(&(pFVar1->value).type);
        if (((bVar2) && ((pFVar1->value).type.element == BASE_TYPE_UCHAR)) &&
           ((pFVar1->value).type.enum_def == (EnumDef *)0x0)) {
          std::operator+(&local_270,"\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          std::operator+(&local_250,&local_270," := flatbuffers.UOffsetT(0)\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_250)
          ;
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::operator+(&local_2b0,"\tif t.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_290,&local_2b0," != nil {\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_290)
          ;
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::operator+(&local_330,"\t\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          std::operator+(&local_310,&local_330," = builder.CreateByteString(t.");
          std::operator+(&local_2f0,&local_310,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_2d0,&local_2f0,")\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_2d0)
          ;
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t}\n");
          goto LAB_00290fd3;
        }
        bVar2 = IsVector(&(pFVar1->value).type);
        if (bVar2) {
          std::operator+(&local_370,"\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          std::operator+(&local_350,&local_370," := flatbuffers.UOffsetT(0)\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_350)
          ;
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_370);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&length.field_2 + 8),"\tif t.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_390,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&length.field_2 + 8)," != nil {\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_390)
          ;
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)(length.field_2._M_local_buf + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&offsets.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&offset.field_2 + 8),"Length");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&offset.field_2 + 8),"Offsets");
          std::operator+(&local_470,"\t\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&offsets.field_2 + 8));
          std::operator+(&local_450,&local_470," := len(t.");
          std::operator+(&local_430,&local_450,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_410,&local_430,")\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_410)
          ;
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::string::~string((string *)&local_470);
          if ((pFVar1->value).type.element == BASE_TYPE_STRING) {
            std::operator+(&local_4f0,"\t\t",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3f0);
            std::operator+(&local_4d0,&local_4f0," := make([]flatbuffers.UOffsetT, ");
            std::operator+(&local_4b0,&local_4d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&offsets.field_2 + 8));
            std::operator+(&local_490,&local_4b0,")\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_490);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::__cxx11::string::~string((string *)&local_4f0);
            std::operator+(&local_530,"\t\tfor j := 0; j < ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&offsets.field_2 + 8));
            std::operator+(&local_510,&local_530,"; j++ {\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_510);
            std::__cxx11::string::~string((string *)&local_510);
            std::__cxx11::string::~string((string *)&local_530);
            std::operator+(&local_5b0,"\t\t\t",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3f0);
            std::operator+(&local_590,&local_5b0,"[j] = builder.CreateString(t.");
            std::operator+(&local_570,&local_590,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_var.field_2 + 8));
            std::operator+(&local_550,&local_570,"[j])\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_550);
            std::__cxx11::string::~string((string *)&local_550);
            std::__cxx11::string::~string((string *)&local_570);
            std::__cxx11::string::~string((string *)&local_590);
            std::__cxx11::string::~string((string *)&local_5b0);
            std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t\t}\n");
          }
          else if (((pFVar1->value).type.element == BASE_TYPE_STRUCT) &&
                  ((((pFVar1->value).type.struct_def)->fixed & 1U) == 0)) {
            std::operator+(&local_630,"\t\t",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3f0);
            std::operator+(&local_610,&local_630," := make([]flatbuffers.UOffsetT, ");
            std::operator+(&local_5f0,&local_610,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&offsets.field_2 + 8));
            std::operator+(&local_5d0,&local_5f0,")\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_5d0);
            std::__cxx11::string::~string((string *)&local_5d0);
            std::__cxx11::string::~string((string *)&local_5f0);
            std::__cxx11::string::~string((string *)&local_610);
            std::__cxx11::string::~string((string *)&local_630);
            std::operator+(&local_670,"\t\tfor j := 0; j < ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&offsets.field_2 + 8));
            std::operator+(&local_650,&local_670,"; j++ {\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_650);
            std::__cxx11::string::~string((string *)&local_650);
            std::__cxx11::string::~string((string *)&local_670);
            std::operator+(&local_6f0,"\t\t\t",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3f0);
            std::operator+(&local_6d0,&local_6f0,"[j] = t.");
            std::operator+(&local_6b0,&local_6d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_var.field_2 + 8));
            std::operator+(&local_690,&local_6b0,"[j].Pack(builder)\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_690);
            std::__cxx11::string::~string((string *)&local_690);
            std::__cxx11::string::~string((string *)&local_6b0);
            std::__cxx11::string::~string((string *)&local_6d0);
            std::__cxx11::string::~string((string *)&local_6f0);
            std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t\t}\n");
          }
          std::operator+(&local_7b0,"\t\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48);
          std::operator+(&local_790,&local_7b0,"Start");
          IdlNamer::Function_abi_cxx11_(&local_7d0,&this->namer_,&pFVar1->super_Definition);
          std::operator+(&local_770,&local_790,&local_7d0);
          std::operator+(&local_750,&local_770,"Vector(builder, ");
          std::operator+(&local_730,&local_750,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&offsets.field_2 + 8));
          std::operator+(&local_710,&local_730,")\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_710)
          ;
          std::__cxx11::string::~string((string *)&local_710);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::string::~string((string *)&local_750);
          std::__cxx11::string::~string((string *)&local_770);
          std::__cxx11::string::~string((string *)&local_7d0);
          std::__cxx11::string::~string((string *)&local_790);
          std::__cxx11::string::~string((string *)&local_7b0);
          std::operator+(&local_810,"\t\tfor j := ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&offsets.field_2 + 8));
          std::operator+(&local_7f0,&local_810," - 1; j >= 0; j-- {\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_7f0)
          ;
          std::__cxx11::string::~string((string *)&local_7f0);
          std::__cxx11::string::~string((string *)&local_810);
          bVar2 = IsScalar((pFVar1->value).type.element);
          if (bVar2) {
            Type::VectorType(&local_8f0,&(pFVar1->value).type);
            GenTypeBasic_abi_cxx11_(&local_8d0,this,&local_8f0);
            Namer::Method(&local_8b0,&(this->namer_).super_Namer,&local_8d0);
            std::operator+(&local_890,"\t\t\tbuilder.Prepend",&local_8b0);
            std::operator+(&local_870,&local_890,"(");
            Type::VectorType(&local_930,&(pFVar1->value).type);
            std::operator+(&local_970,"t.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_var.field_2 + 8));
            std::operator+(&local_950,&local_970,"[j]");
            CastToBaseType(&local_910,this,&local_930,&local_950);
            std::operator+(&local_850,&local_870,&local_910);
            std::operator+(&local_830,&local_850,")\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_830);
            std::__cxx11::string::~string((string *)&local_830);
            std::__cxx11::string::~string((string *)&local_850);
            std::__cxx11::string::~string((string *)&local_910);
            std::__cxx11::string::~string((string *)&local_950);
            std::__cxx11::string::~string((string *)&local_970);
            std::__cxx11::string::~string((string *)&local_870);
            std::__cxx11::string::~string((string *)&local_890);
            std::__cxx11::string::~string((string *)&local_8b0);
            std::__cxx11::string::~string((string *)&local_8d0);
          }
          else if (((pFVar1->value).type.element == BASE_TYPE_STRUCT) &&
                  ((((pFVar1->value).type.struct_def)->fixed & 1U) != 0)) {
            std::operator+(&local_9b0,"\t\t\tt.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_var.field_2 + 8));
            std::operator+(&local_990,&local_9b0,"[j].Pack(builder)\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_990);
            std::__cxx11::string::~string((string *)&local_990);
            std::__cxx11::string::~string((string *)&local_9b0);
          }
          else {
            std::operator+(&local_9f0,"\t\t\tbuilder.PrependUOffsetT(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3f0);
            std::operator+(&local_9d0,&local_9f0,"[j])\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_9d0);
            std::__cxx11::string::~string((string *)&local_9d0);
            std::__cxx11::string::~string((string *)&local_9f0);
          }
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t\t}\n");
          std::operator+(&local_a70,"\t\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          std::operator+(&local_a50,&local_a70," = builder.EndVector(");
          std::operator+(&local_a30,&local_a50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&offsets.field_2 + 8));
          std::operator+(&local_a10,&local_a30,")\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_a10)
          ;
          std::__cxx11::string::~string((string *)&local_a10);
          std::__cxx11::string::~string((string *)&local_a30);
          std::__cxx11::string::~string((string *)&local_a50);
          std::__cxx11::string::~string((string *)&local_a70);
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t}\n");
          std::__cxx11::string::~string((string *)local_3f0);
          std::__cxx11::string::~string((string *)(offsets.field_2._M_local_buf + 8));
          goto LAB_00290fd3;
        }
        if ((pFVar1->value).type.base_type != BASE_TYPE_STRUCT) {
          if ((pFVar1->value).type.base_type != BASE_TYPE_UNION) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                          ,0x496,
                          "void flatbuffers::go::GoGenerator::GenNativeTablePack(const StructDef &, std::string *)"
                         );
          }
          std::operator+(&local_b78,"\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          std::operator+(&local_b58,&local_b78," := t.");
          std::operator+(&local_b38,&local_b58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_b18,&local_b38,".Pack(builder)\n\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_b18)
          ;
          std::__cxx11::string::~string((string *)&local_b18);
          std::__cxx11::string::~string((string *)&local_b38);
          std::__cxx11::string::~string((string *)&local_b58);
          std::__cxx11::string::~string((string *)&local_b78);
          goto LAB_00290fd3;
        }
        if ((((pFVar1->value).type.struct_def)->fixed & 1U) == 0) {
          std::operator+(&local_af8,"\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          std::operator+(&local_ad8,&local_af8," := t.");
          std::operator+(&local_ab8,&local_ad8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_a98,&local_ab8,".Pack(builder)\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_a98)
          ;
          std::__cxx11::string::~string((string *)&local_a98);
          std::__cxx11::string::~string((string *)&local_ab8);
          std::__cxx11::string::~string((string *)&local_ad8);
          std::__cxx11::string::~string((string *)&local_af8);
          goto LAB_00290fd3;
        }
        local_a74 = 4;
      }
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)(offset.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_var.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_c0);
  } while( true );
}

Assistant:

void GenNativeTablePack(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string struct_type = namer_.Type(struct_def);

    code += "func (t *" + NativeName(struct_def) +
            ") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n";
    code += "\tif t == nil {\n\t\treturn 0\n\t}\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      if (IsScalar(field.value.type.base_type)) continue;

      const std::string field_field = namer_.Field(field);
      const std::string field_var = namer_.Variable(field);
      const std::string offset = field_var + "Offset";

      if (IsString(field.value.type)) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != \"\" {\n";
        code += "\t\t" + offset + " = builder.CreateString(t." + field_field +
                ")\n";
        code += "\t}\n";
      } else if (IsVector(field.value.type) &&
                 field.value.type.element == BASE_TYPE_UCHAR &&
                 field.value.type.enum_def == nullptr) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != nil {\n";
        code += "\t\t" + offset + " = builder.CreateByteString(t." +
                field_field + ")\n";
        code += "\t}\n";
      } else if (IsVector(field.value.type)) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != nil {\n";
        std::string length = field_var + "Length";
        std::string offsets = field_var + "Offsets";
        code += "\t\t" + length + " := len(t." + field_field + ")\n";
        if (field.value.type.element == BASE_TYPE_STRING) {
          code += "\t\t" + offsets + " := make([]flatbuffers.UOffsetT, " +
                  length + ")\n";
          code += "\t\tfor j := 0; j < " + length + "; j++ {\n";
          code += "\t\t\t" + offsets + "[j] = builder.CreateString(t." +
                  field_field + "[j])\n";
          code += "\t\t}\n";
        } else if (field.value.type.element == BASE_TYPE_STRUCT &&
                   !field.value.type.struct_def->fixed) {
          code += "\t\t" + offsets + " := make([]flatbuffers.UOffsetT, " +
                  length + ")\n";
          code += "\t\tfor j := 0; j < " + length + "; j++ {\n";
          code += "\t\t\t" + offsets + "[j] = t." + field_field +
                  "[j].Pack(builder)\n";
          code += "\t\t}\n";
        }
        code += "\t\t" + struct_type + "Start" + namer_.Function(field) +
                "Vector(builder, " + length + ")\n";
        code += "\t\tfor j := " + length + " - 1; j >= 0; j-- {\n";
        if (IsScalar(field.value.type.element)) {
          code += "\t\t\tbuilder.Prepend" +
                  namer_.Method(GenTypeBasic(field.value.type.VectorType())) +
                  "(" +
                  CastToBaseType(field.value.type.VectorType(),
                                 "t." + field_field + "[j]") +
                  ")\n";
        } else if (field.value.type.element == BASE_TYPE_STRUCT &&
                   field.value.type.struct_def->fixed) {
          code += "\t\t\tt." + field_field + "[j].Pack(builder)\n";
        } else {
          code += "\t\t\tbuilder.PrependUOffsetT(" + offsets + "[j])\n";
        }
        code += "\t\t}\n";
        code += "\t\t" + offset + " = builder.EndVector(" + length + ")\n";
        code += "\t}\n";
      } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        if (field.value.type.struct_def->fixed) continue;
        code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n";
      } else if (field.value.type.base_type == BASE_TYPE_UNION) {
        code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n\n";
      } else {
        FLATBUFFERS_ASSERT(0);
      }
    }
    code += "\t" + struct_type + "Start(builder)\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      const std::string field_field = namer_.Field(field);
      const std::string field_fn = namer_.Function(field);
      const std::string offset = namer_.Variable(field) + "Offset";

      if (IsScalar(field.value.type.base_type)) {
        std::string prefix;
        if (field.IsScalarOptional()) {
          code += "\tif t." + field_field + " != nil {\n\t";
          prefix = "*";
        }
        if (field.value.type.enum_def == nullptr ||
            !field.value.type.enum_def->is_union) {
          code += "\t" + struct_type + "Add" + field_fn + "(builder, " +
                  prefix + "t." + field_field + ")\n";
        }
        if (field.IsScalarOptional()) { code += "\t}\n"; }
      } else {
        if (field.value.type.base_type == BASE_TYPE_STRUCT &&
            field.value.type.struct_def->fixed) {
          code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n";
        } else if (field.value.type.enum_def != nullptr &&
                   field.value.type.enum_def->is_union) {
          code += "\tif t." + field_field + " != nil {\n";
          code += "\t\t" + struct_type + "Add" +
                  namer_.Method(field.name + UnionTypeFieldSuffix()) +
                  "(builder, t." + field_field + ".Type)\n";
          code += "\t}\n";
        }
        code += "\t" + struct_type + "Add" + field_fn + "(builder, " + offset +
                ")\n";
      }
    }
    code += "\treturn " + struct_type + "End(builder)\n";
    code += "}\n\n";
  }